

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chachapoly.c
# Opt level: O3

void mbedtls_chachapoly_free(mbedtls_chachapoly_context *ctx)

{
  if (ctx != (mbedtls_chachapoly_context *)0x0) {
    mbedtls_chacha20_free(&ctx->chacha20_ctx);
    mbedtls_poly1305_free(&ctx->poly1305_ctx);
    ctx->aad_len = 0;
    ctx->ciphertext_len = 0;
    ctx->state = 0;
    ctx->mode = MBEDTLS_CHACHAPOLY_ENCRYPT;
  }
  return;
}

Assistant:

void mbedtls_chachapoly_free( mbedtls_chachapoly_context *ctx )
{
    if( ctx == NULL )
        return;

    mbedtls_chacha20_free( &ctx->chacha20_ctx );
    mbedtls_poly1305_free( &ctx->poly1305_ctx );
    ctx->aad_len        = 0U;
    ctx->ciphertext_len = 0U;
    ctx->state          = CHACHAPOLY_STATE_INIT;
    ctx->mode           = MBEDTLS_CHACHAPOLY_ENCRYPT;
}